

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bgpsec.c
# Opt level: O2

spki_record * create_record(int ASN,uint8_t *ski,uint8_t *spki)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  spki_record *psVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar5 = (spki_record *)calloc(1,0x80);
  psVar5->asn = ASN;
  uVar2 = *(undefined4 *)(ski + 4);
  uVar3 = *(undefined4 *)(ski + 8);
  uVar4 = *(undefined4 *)(ski + 0xc);
  *(undefined4 *)psVar5->ski = *(undefined4 *)ski;
  *(undefined4 *)(psVar5->ski + 4) = uVar2;
  *(undefined4 *)(psVar5->ski + 8) = uVar3;
  *(undefined4 *)(psVar5->ski + 0xc) = uVar4;
  *(undefined4 *)(psVar5->ski + 0x10) = *(undefined4 *)(ski + 0x10);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    memcpy(psVar5->spki,spki,0x5b);
    return psVar5;
  }
  __stack_chk_fail();
}

Assistant:

static struct spki_record *create_record(int ASN, uint8_t *ski, uint8_t *spki)
{
	struct spki_record *record = malloc(sizeof(struct spki_record));

	memset(record, 0, sizeof(*record));
	record->asn = ASN;
	memcpy(record->ski, ski, SKI_SIZE);
	memcpy(record->spki, spki, SPKI_SIZE);
	record->socket = NULL;
	return record;
}